

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O0

Point __thiscall ellipses::estimate_target_center(ellipses *this,Mat *pretreat,bool debug)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  _InputArray local_150;
  undefined1 local_134 [28];
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *v;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *__range1;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> result;
  _OutputArray local_e0;
  _InputArray local_c8;
  undefined1 local_b0 [8];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  allocator<char> local_79;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [39];
  undefined1 local_19;
  Mat *pMStack_18;
  bool debug_local;
  Mat *pretreat_local;
  
  local_19 = debug;
  pMStack_18 = pretreat;
  pretreat_local = (Mat *)this;
  if (debug) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"gray",&local_41);
    cv::namedWindow(local_40,0);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,"gray",&local_79);
    cv::_InputArray::_InputArray
              ((_InputArray *)
               &contours.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pMStack_18);
    cv::imshow(local_78,(_InputArray *)
                        &contours.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::~_InputArray
              ((_InputArray *)
               &contours.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    cv::waitKey(0);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)local_b0);
  cv::_InputArray::_InputArray(&local_c8,pMStack_18);
  cv::_OutputArray::_OutputArray<cv::Point_<int>>
            (&local_e0,
             (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              *)local_b0);
  cv::Point_<int>::Point_
            ((Point_<int> *)
             &result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::findContours(&local_c8,&local_e0,1,2,
                   &result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_OutputArray::~_OutputArray(&local_e0);
  cv::_InputArray::~_InputArray(&local_c8);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
  __end1 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::begin((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    *)local_b0);
  v = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::end((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_b0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                                *)&v);
    if (!bVar1) break;
    local_134._20_8_ =
         __gnu_cxx::
         __normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
         ::operator*(&__end1);
    sVar2 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                       local_134._20_8_);
    sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
    if (sVar3 < sVar2) {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1,
                 (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_134._20_8_);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
    ::operator++(&__end1);
  }
  cv::_InputArray::_InputArray<cv::Point_<int>>
            (&local_150,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
  cv::fitEllipse((_InputArray *)local_134);
  cv::Point_::operator_cast_to_Point_((Point_ *)this);
  cv::_InputArray::~_InputArray(&local_150);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_b0);
  return (Point)this;
}

Assistant:

cv::Point estimate_target_center(const cv::Mat& pretreat, bool debug)
{
    if(debug)
    {
        cv::namedWindow("gray", cv::WINDOW_NORMAL);
        cv::imshow("gray", pretreat);
        cv::waitKey(0);
    }

    std::vector<std::vector<cv::Point>> contours;
    findContours(pretreat, contours, cv::RETR_LIST, cv::CHAIN_APPROX_SIMPLE);

    std::vector<cv::Point> result;

    for(auto& v : contours)
    {
        if(v.size() > result.size())
        {
            result = std::move(v);
        }
    }

    return cv::fitEllipse(result).center;
}